

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::DummyDataParameter::Clear(DummyDataParameter *this)

{
  DummyDataParameter *this_local;
  
  google::protobuf::RepeatedPtrField<caffe::FillerParameter>::Clear(&this->data_filler_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->num_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->channels_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->height_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->width_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::Clear(&this->shape_);
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void DummyDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.DummyDataParameter)
  data_filler_.Clear();
  num_.Clear();
  channels_.Clear();
  height_.Clear();
  width_.Clear();
  shape_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}